

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (StreamingConcatenationExpression *bitstream,BitstreamSizeMode mode)

{
  format_string<unsigned_long_&> fmt;
  format_string<unsigned_long_&> fmt_00;
  format_string<> fmt_01;
  format_string<unsigned_long_&,_unsigned_long_&> fmt_02;
  bool bVar1;
  FormatBuffer *in_RDI;
  DynamicSize size;
  FormatBuffer buffer;
  FormatBuffer *in_stack_fffffffffffffd48;
  unsigned_long *in_stack_fffffffffffffd80;
  FormatBuffer *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  unsigned_long *in_stack_fffffffffffffd98;
  FormatBuffer *in_stack_fffffffffffffda0;
  FormatBuffer *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  BitstreamSizeMode in_stack_fffffffffffffdec;
  StreamingConcatenationExpression *in_stack_fffffffffffffdf0;
  
  FormatBuffer::FormatBuffer(in_RDI);
  dynamicBitstreamSize(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  bVar1 = DynamicSize::operator_cast_to_bool((DynamicSize *)&stack0xfffffffffffffdb0);
  if (bVar1) {
    if (in_stack_fffffffffffffdb0 == (char *)0x0) {
      fmt.str.size_ = (size_t)in_stack_fffffffffffffd98;
      fmt.str.data_ = in_stack_fffffffffffffd90;
      FormatBuffer::format<unsigned_long&>((FormatBuffer *)0x2,fmt,(unsigned_long *)0xc9ef2f);
    }
    else if (in_stack_fffffffffffffdb8 == 0) {
      fmt_00.str.size_ = (size_t)in_stack_fffffffffffffd98;
      fmt_00.str.data_ = in_stack_fffffffffffffd90;
      FormatBuffer::format<unsigned_long&>
                (in_stack_fffffffffffffd88,fmt_00,in_stack_fffffffffffffd80);
    }
    else {
      fmt_02.str.size_ = in_stack_fffffffffffffdb8;
      fmt_02.str.data_ = in_stack_fffffffffffffdb0;
      FormatBuffer::format<unsigned_long&,unsigned_long&>
                (in_stack_fffffffffffffda8,fmt_02,(unsigned_long *)in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
    }
  }
  else {
    fmt_01.str.size_ = (size_t)in_stack_fffffffffffffdb0;
    fmt_01.str.data_ = (char *)in_stack_fffffffffffffda8;
    FormatBuffer::format<>(in_stack_fffffffffffffda0,fmt_01);
  }
  FormatBuffer::str_abi_cxx11_(in_stack_fffffffffffffd48);
  FormatBuffer::~FormatBuffer((FormatBuffer *)0x79782d);
  return (string *)in_RDI;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto size = dynamicBitstreamSize(bitstream, mode);
    if (!size)
        buffer.format("<overflow>");
    else if (!size.multiplier)
        buffer.format("{}", size.fixed);
    else if (!size.fixed)
        buffer.format("{}*n", size.multiplier);
    else
        buffer.format("{}*n+{}", size.multiplier, size.fixed);
    return buffer.str();
}